

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O1

bool __thiscall QPDFFormFieldObjectHelper::isChecked(QPDFFormFieldObjectHelper *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  undefined1 local_60 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  bVar1 = isCheckbox(this);
  if (bVar1) {
    getValue((QPDFFormFieldObjectHelper *)(local_60 + 0x10));
    bVar2 = QPDFObjectHandle::isName((QPDFObjectHandle *)(local_60 + 0x10));
    if (bVar2) {
      getValue((QPDFFormFieldObjectHelper *)local_60);
      QPDFObjectHandle::getName_abi_cxx11_((string *)(local_60 + 0x20),(QPDFObjectHandle *)local_60)
      ;
      iVar3 = std::__cxx11::string::compare(local_60 + 0x20);
      bVar4 = iVar3 != 0;
      bVar2 = true;
      goto LAB_0016a477;
    }
  }
  bVar2 = false;
  bVar4 = false;
LAB_0016a477:
  if (bVar2) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._32_8_ != &local_30) {
      operator_delete((void *)local_60._32_8_,(ulong)(local_30._M_allocated_capacity + 1));
    }
    if ((element_type *)local_60._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
    }
  }
  if ((bVar1) && ((element_type *)local_60._24_8_ != (element_type *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._24_8_);
  }
  return bVar4;
}

Assistant:

bool
QPDFFormFieldObjectHelper::isChecked()
{
    return isCheckbox() && getValue().isName() && (getValue().getName() != "/Off");
}